

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_coders_info *val;
  uint *puVar2;
  byte bVar3;
  _7z_stream_info *si;
  uint64_t uVar4;
  _7z_stream_info *si_00;
  size_t sVar5;
  uchar uVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  uchar *p;
  uLong uVar10;
  int64_t iVar11;
  uint64_t *puVar12;
  uint32_t *puVar13;
  archive_string_conv *paVar14;
  int *piVar15;
  char *pcVar16;
  uchar *puVar17;
  undefined8 extraout_RAX;
  byte *pbVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  uchar *puVar23;
  long lVar24;
  _7z_coder *p_Var25;
  _7z_coder *p_Var26;
  char *pcVar27;
  long lVar28;
  size_t b;
  _7z_folder *p_Var29;
  size_t rbytes;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint64_t uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  _7z_folder *p_Var37;
  char *pcVar38;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  bool bVar42;
  uint64_t *local_a0;
  uint64_t size;
  ulong local_78;
  _7z_folder *local_70;
  undefined4 local_64;
  int64_t offset;
  _7z_header_info header;
  
  si = (_7z_stream_info *)a->format->data;
  if (*(int *)&si[199].pi.digest.digests == -1) {
    *(undefined4 *)&si[199].pi.digest.digests = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders != (_7z_folder *)0x0) {
    puVar12 = si[1].pi.positions;
    p_Var37 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x58);
    goto LAB_0035e28d;
  }
  header.emptyFileBools = (uchar *)0x0;
  header.antiBools = (uchar *)0x0;
  header.dataIndex = 0;
  header.emptyStreamBools = (uchar *)0x0;
  header.attrBools = (uchar *)0x0;
  piVar15 = (int *)__archive_read_ahead(a,0x20,&offset);
  iVar9 = -0x1e;
  if (piVar15 == (int *)0x0) {
LAB_0035e23d:
    bVar42 = false;
  }
  else {
    if ((((char)*piVar15 == 'M') && (*(char *)((long)piVar15 + 1) == 'Z')) ||
       (*piVar15 == 0x464c457f)) {
      if (offset < 0x27001) {
        iVar11 = __archive_read_seek(a,0x27000,0);
        if (iVar11 < 0) goto LAB_0035e23d;
      }
      else {
        __archive_read_consume(a,0x27000);
      }
      lVar39 = 0;
      uVar41 = 1;
      do {
        while( true ) {
          uVar21 = uVar41;
          if (0x39000 < uVar21 + lVar39) goto LAB_0035e17b;
          pcVar27 = (char *)__archive_read_ahead(a,uVar21,(ssize_t *)&size);
          if (pcVar27 == (char *)0x0) break;
          uVar41 = 0x1000;
          if (5 < (long)size) {
            pcVar38 = pcVar27 + size;
            for (pcVar16 = pcVar27; pcVar16 + 0x20 < pcVar38; pcVar16 = pcVar16 + uVar31) {
              uVar31 = check_7zip_header_in_sfx(pcVar16);
              if (uVar31 == 0) {
                pvVar22 = a->format->data;
                __archive_read_consume(a,(long)pcVar16 - (long)pcVar27);
                *(long *)((long)pvVar22 + 0x88) = lVar39 + ((long)pcVar16 - (long)pcVar27) + 0x27000
                ;
                piVar15 = (int *)__archive_read_ahead(a,0x20,&offset);
                iVar9 = -0x1e;
                if (piVar15 != (int *)0x0) goto LAB_0035e065;
                goto LAB_0035e23d;
              }
            }
            __archive_read_consume(a,(long)pcVar16 - (long)pcVar27);
            lVar39 = lVar39 + ((long)pcVar16 - (long)pcVar27);
            uVar41 = uVar21;
            if (uVar21 == 1) {
              uVar41 = 0x1000;
            }
          }
        }
        uVar41 = uVar21 >> 1;
      } while (0x7f < uVar21);
LAB_0035e17b:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
      iVar9 = -0x1e;
      goto LAB_0035e23d;
    }
LAB_0035e065:
    iVar9 = -0x1e;
    ppuVar1 = &si[1].pi.digest.digests;
    *ppuVar1 = *ppuVar1 + 8;
    iVar8 = bcmp(piVar15,anon_var_dwarf_f0c0c3,6);
    if (iVar8 != 0) {
      pcVar27 = "Not 7-Zip archive file";
LAB_0035e22e:
      archive_set_error(&a->archive,-1,pcVar27);
      goto LAB_0035e23d;
    }
    uVar10 = cm_zlib_crc32(0,(uchar *)(piVar15 + 3),0x14);
    if (uVar10 != (uint)piVar15[2]) {
      pcVar27 = "Header CRC error";
      goto LAB_0035e22e;
    }
    uVar33 = *(uint64_t *)(piVar15 + 5);
    if (uVar33 == 0) {
      iVar9 = 1;
      goto LAB_0035e23d;
    }
    puVar12 = *(uint64_t **)(piVar15 + 3);
    if ((long)puVar12 < 0) {
LAB_0035f19a:
      pcVar27 = "Malformed 7-Zip archive";
LAB_0035f1a9:
      archive_set_error(&a->archive,-1,pcVar27);
LAB_0035f1b5:
      bVar42 = false;
      iVar9 = -0x1e;
    }
    else {
      local_a0 = (uint64_t *)(ulong)(uint)piVar15[7];
      __archive_read_consume(a,0x20);
      if (puVar12 != (uint64_t *)0x0) {
        if ((long)puVar12 <= offset) {
          __archive_read_consume(a,(int64_t)puVar12);
          goto LAB_0035e65f;
        }
        iVar11 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar12,0);
        if (-1 < iVar11) goto LAB_0035e65f;
        goto LAB_0035f1b5;
      }
LAB_0035e65f:
      si[2].pi.positions = puVar12;
      si[1].pi.digest.defineds = (uchar *)puVar12;
      si[1].pi.numPackStreams = uVar33;
      si[1].pi.sizes = (uint64_t *)0x0;
      si[1].pi.pos = 1;
      *(undefined4 *)&si[199].pi.digest.digests = 0;
      puVar17 = header_bytes(a,1);
      if (puVar17 == (uchar *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        goto LAB_0035f1b5;
      }
      iVar9 = -0x1e;
      if (*puVar17 == '\x17') {
        pvVar22 = a->format->data;
        piVar15 = __errno_location();
        *piVar15 = 0;
        iVar9 = read_StreamsInfo(a,si);
        if (iVar9 < 0) {
          pcVar27 = "Malformed 7-Zip archive";
          if (*piVar15 == 0xc) {
            pcVar27 = "Couldn\'t allocate memory";
          }
LAB_0035e7e0:
          archive_set_error(&a->archive,-1,pcVar27);
          iVar9 = -0x1e;
LAB_0035e7f3:
          bVar42 = true;
        }
        else {
          pcVar27 = "Malformed 7-Zip archive";
          if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0)) goto LAB_0035e7e0;
          uVar33 = (si->pi).pos;
          pcVar27 = "Malformed Header offset";
          if ((((long)uVar33 < 0) ||
              ((uVar4 = *(si->pi).sizes, uVar4 == 0 ||
               (uVar41 = uVar4 + uVar33, *(ulong *)((long)pvVar22 + 0x80) < uVar41)))) ||
             ((long)uVar41 < 0)) goto LAB_0035e7e0;
          if (si[1].pi.sizes != local_a0) {
            iVar9 = -1;
            archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
            goto LAB_0035e7f3;
          }
          p_Var37 = (si->ci).folders;
          bVar42 = p_Var37->digest_defined != '\0';
          if (bVar42) {
            local_a0 = (uint64_t *)(ulong)p_Var37->digest;
          }
          if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
            read_consume(a);
            p_Var37 = (si->ci).folders;
          }
          iVar9 = setup_decode_folder(a,p_Var37,1);
          if (iVar9 == 0) {
            si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
            iVar9 = seek_pack(a);
          }
        }
        free_StreamsInfo(si);
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ci).dataStreamIndex = 0;
        (si->ss).unpack_streams = 0;
        (si->ci).numFolders = 0;
        (si->ci).folders = (_7z_folder *)0x0;
        (si->pi).digest.digests = (uint32_t *)0x0;
        (si->pi).positions = (uint64_t *)0x0;
        (si->pi).sizes = (uint64_t *)0x0;
        (si->pi).digest.defineds = (uchar *)0x0;
        (si->pi).pos = 0;
        (si->pi).numPackStreams = 0;
        (si->ss).digests = (uint32_t *)0x0;
        if (-1 < iVar9) {
          *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
          si[1].pi.sizes = (uint64_t *)0x0;
          local_64 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar42);
          goto LAB_0035e849;
        }
        goto LAB_0035f1b5;
      }
      if (*puVar17 == '\x01') {
        local_64 = 0;
        piVar15 = __errno_location();
LAB_0035e849:
        *piVar15 = 0;
        si_00 = (_7z_stream_info *)a->format->data;
        if (((*(int *)((long)&si[1].pi.pos + 4) == 0) ||
            ((puVar17 = header_bytes(a,1), puVar17 != (uchar *)0x0 && (*puVar17 == '\x01')))) &&
           (puVar17 = header_bytes(a,1), puVar17 != (uchar *)0x0)) {
          uVar6 = *puVar17;
          if (uVar6 == '\x02') {
            do {
              puVar17 = header_bytes(a,1);
              if (puVar17 == (uchar *)0x0) break;
              if (*puVar17 == '\0') {
                puVar17 = header_bytes(a,1);
                if (puVar17 != (uchar *)0x0) {
                  uVar6 = *puVar17;
                  goto LAB_0035e8f7;
                }
                break;
              }
              iVar9 = parse_7zip_uint64(a,&size);
            } while (-1 < iVar9);
          }
          else {
LAB_0035e8f7:
            if (uVar6 == '\x04') {
              iVar9 = read_StreamsInfo(a,si_00);
              if ((iVar9 < 0) || (puVar17 = header_bytes(a,1), puVar17 == (uchar *)0x0))
              goto LAB_0035ef50;
              uVar6 = *puVar17;
            }
            if (uVar6 == '\0') {
LAB_0035f182:
              puVar17 = header_bytes(a,1);
              if ((puVar17 == (uchar *)0x0) || (*puVar17 != '\0')) goto LAB_0035f19a;
              if (((char)local_64 == '\0') && (si[1].pi.sizes != local_a0)) {
                pcVar27 = "Malformed 7-Zip archive";
                goto LAB_0035f1a9;
              }
              si[2].pi.digest.digests = (uint32_t *)0x0;
              si[2].ss.unpackSizes = (uint64_t *)0x0;
              *(undefined4 *)&si[1].pi.pos = 0;
              si[2].ci.folders = (_7z_folder *)0x0;
              si[2].ci.dataStreamIndex = 0;
              iVar9 = 0;
              bVar42 = true;
              goto LAB_0035e242;
            }
            if (uVar6 == '\x05') {
              val = &si_00[1].ci;
              iVar9 = parse_7zip_uint64(a,&val->numFolders);
              if ((-1 < iVar9) && (val->numFolders < 0x5f5e101)) {
                local_70 = (_7z_folder *)calloc(val->numFolders,0x58);
                si_00[1].ci.folders = local_70;
                if (local_70 != (_7z_folder *)0x0) {
                  local_78 = 0;
LAB_0035e99e:
                  do {
                    pbVar18 = header_bytes(a,1);
                    if (pbVar18 == (byte *)0x0) break;
                    bVar3 = *pbVar18;
                    if (bVar3 == 0) {
                      p_Var37 = (si_00->ci).folders;
                      uVar31 = 0;
                      uVar36 = 0;
                      uVar34 = 0;
                      local_78 = 0;
                      iVar9 = 0;
                      goto LAB_0035efa3;
                    }
                    iVar9 = parse_7zip_uint64(a,&size);
                    uVar33 = size;
                    if ((iVar9 < 0) || (si_00[1].pi.numPackStreams < size)) break;
                    if (bVar3 - 0xe < 0xc) {
                      uVar41 = local_78 & 0xffffffff;
                      switch((uint)bVar3) {
                      case 0xe:
                        if (header.emptyStreamBools != (uchar *)0x0) goto LAB_0035ef50;
                        sVar5 = val->numFolders;
                        puVar17 = (uchar *)calloc(sVar5,1);
                        header.emptyStreamBools = puVar17;
                        if ((puVar17 == (uchar *)0x0) ||
                           (iVar9 = read_Bools(a,puVar17,sVar5), iVar9 < 0)) goto LAB_0035ef50;
                        local_78 = 0;
                        for (uVar31 = 0; (ulong)uVar31 < val->numFolders; uVar31 = uVar31 + 1) {
                          local_78 = (ulong)(((int)local_78 + 1) - (uint)(puVar17[uVar31] == '\0'));
                        }
                        goto LAB_0035e99e;
                      case 0xf:
                        if (0 < (int)local_78) {
                          if (header.emptyFileBools != (uchar *)0x0) goto LAB_0035ef50;
                          puVar17 = (uchar *)calloc(uVar41,1);
                          header.emptyFileBools = puVar17;
LAB_0035ecb4:
                          if ((puVar17 == (uchar *)0x0) ||
                             (iVar9 = read_Bools(a,puVar17,uVar41), iVar9 < 0)) goto LAB_0035ef50;
                          goto LAB_0035e99e;
                        }
                        break;
                      case 0x10:
                        if (0 < (int)local_78) {
                          if (header.antiBools == (uchar *)0x0) {
                            puVar17 = (uchar *)calloc(uVar41,1);
                            header.antiBools = puVar17;
                            goto LAB_0035ecb4;
                          }
                          goto LAB_0035ef50;
                        }
                        break;
                      case 0x11:
                        puVar17 = header_bytes(a,1);
                        if ((((puVar17 == (uchar *)0x0) || (uVar41 = uVar33 - 1, (uVar41 & 1) != 0))
                            || (uVar41 < val->numFolders << 2)) || (si_00[1].ss.unpack_streams != 0)
                           ) goto LAB_0035ef50;
                        pvVar22 = malloc(uVar41);
                        si_00[1].ss.unpack_streams = (size_t)pvVar22;
                        uVar21 = uVar41;
                        if (pvVar22 == (void *)0x0) goto LAB_0035ef50;
                        for (; uVar21 != 0; uVar21 = uVar21 - rbytes) {
                          rbytes = 0x10000;
                          if (uVar21 < 0x10000) {
                            rbytes = uVar21;
                          }
                          puVar17 = header_bytes(a,rbytes);
                          if (puVar17 == (uchar *)0x0) goto LAB_0035ef50;
                          memcpy(pvVar22,puVar17,rbytes);
                          pvVar22 = (void *)((long)pvVar22 + rbytes);
                        }
                        uVar21 = si_00[1].ci.numFolders;
                        p_Var25 = (_7z_coder *)si_00[1].ss.unpack_streams;
                        for (uVar31 = 0; uVar20 = (ulong)uVar31, uVar20 < uVar21;
                            uVar31 = uVar31 + 1) {
                          (&local_70->coders)[uVar20 * 0xb] = p_Var25;
                          uVar33 = 0;
                          uVar35 = uVar41;
                          p_Var26 = p_Var25;
                          while( true ) {
                            p_Var25 = (_7z_coder *)((long)&p_Var26->codec + 2);
                            if (uVar35 < 2) goto LAB_0035ef50;
                            if (((char)p_Var26->codec == '\0') &&
                               (*(undefined1 *)((long)&p_Var26->codec + 1) == '\0')) break;
                            uVar35 = uVar35 - 2;
                            uVar33 = uVar33 + 2;
                            p_Var26 = p_Var25;
                          }
                          (&local_70->numCoders)[uVar20 * 0xb] = uVar33;
                          uVar41 = (uVar41 - uVar33) - 2;
                        }
                        goto LAB_0035e99e;
                      default:
                        pvVar22 = a->format->data;
                        lVar39 = *(long *)((long)pvVar22 + 0xa0);
                        puVar17 = (uchar *)calloc(*(size_t *)((long)pvVar22 + 0x98),1);
                        if (puVar17 == (uchar *)0x0) goto LAB_0035ef50;
                        puVar23 = header_bytes(a,1);
                        if (puVar23 != (uchar *)0x0) {
                          if (*puVar23 == '\0') {
                            iVar9 = read_Bools(a,puVar17,*(size_t *)((long)pvVar22 + 0x98));
                            if (iVar9 < 0) goto LAB_0035ef48;
                          }
                          else {
                            memset(puVar17,1,*(size_t *)((long)pvVar22 + 0x98));
                          }
                          puVar23 = header_bytes(a,1);
                          if ((puVar23 != (uchar *)0x0) &&
                             ((*puVar23 == '\0' ||
                              ((iVar9 = parse_7zip_uint64(a,&header.dataIndex), -1 < iVar9 &&
                               (header.dataIndex < 0x5f5e101)))))) {
                            for (uVar31 = 0; uVar41 = (ulong)uVar31,
                                uVar41 < *(ulong *)((long)pvVar22 + 0x98); uVar31 = uVar31 + 1) {
                              if (puVar17[uVar41] != '\0') {
                                puVar19 = (ulong *)header_bytes(a,8);
                                if (puVar19 == (ulong *)0x0) goto LAB_0035ef48;
                                if (bVar3 == 0x14) {
                                  if (*puVar19 < 0x19db1ded53e8000) {
                                    uVar21 = 0;
                                    lVar24 = 0;
                                  }
                                  else {
                                    uVar20 = *puVar19 + 0xfe624e212ac18000;
                                    uVar21 = uVar20 / 10000000;
                                    lVar24 = (uVar20 % 10000000) * 100;
                                  }
                                  lVar28 = uVar41 * 0x58 + lVar39;
                                  *(ulong *)(lVar28 + 0x20) = uVar21;
                                  *(long *)(lVar28 + 0x38) = lVar24;
                                  uVar34 = 1;
                                }
                                else if (bVar3 == 0x13) {
                                  if (*puVar19 < 0x19db1ded53e8000) {
                                    uVar21 = 0;
                                    lVar24 = 0;
                                  }
                                  else {
                                    uVar20 = *puVar19 + 0xfe624e212ac18000;
                                    uVar21 = uVar20 / 10000000;
                                    lVar24 = (uVar20 % 10000000) * 100;
                                  }
                                  lVar28 = uVar41 * 0x58 + lVar39;
                                  *(ulong *)(lVar28 + 0x28) = uVar21;
                                  *(long *)(lVar28 + 0x40) = lVar24;
                                  uVar34 = 2;
                                }
                                else {
                                  if (bVar3 != 0x12) goto LAB_0035ebea;
                                  if (*puVar19 < 0x19db1ded53e8000) {
                                    uVar21 = 0;
                                    lVar24 = 0;
                                  }
                                  else {
                                    uVar20 = *puVar19 + 0xfe624e212ac18000;
                                    uVar21 = uVar20 / 10000000;
                                    lVar24 = (uVar20 % 10000000) * 100;
                                  }
                                  lVar28 = uVar41 * 0x58 + lVar39;
                                  *(ulong *)(lVar28 + 0x30) = uVar21;
                                  *(long *)(lVar28 + 0x48) = lVar24;
                                  uVar34 = 4;
                                }
                                puVar2 = (uint *)(lVar39 + 0x18 + uVar41 * 0x58);
                                *puVar2 = *puVar2 | uVar34;
                              }
LAB_0035ebea:
                            }
                            free(puVar17);
                            goto LAB_0035e99e;
                          }
                        }
LAB_0035ef48:
                        free(puVar17);
                        goto LAB_0035ef50;
                      case 0x15:
                        puVar17 = header_bytes(a,2);
                        if ((puVar17 == (uchar *)0x0) || (header.attrBools != (uchar *)0x0))
                        goto LAB_0035ef50;
                        uVar6 = *puVar17;
                        sVar5 = val->numFolders;
                        puVar17 = (uchar *)calloc(sVar5,1);
                        header.attrBools = puVar17;
                        if (puVar17 == (uchar *)0x0) goto LAB_0035ef50;
                        if (uVar6 == '\0') {
                          iVar9 = read_Bools(a,puVar17,sVar5);
                          if (iVar9 < 0) goto LAB_0035ef50;
                        }
                        else {
                          memset(puVar17,1,sVar5);
                        }
                        for (uVar31 = 0; uVar41 = (ulong)uVar31, uVar41 < val->numFolders;
                            uVar31 = uVar31 + 1) {
                          if (puVar17[uVar41] != '\0') {
                            puVar23 = header_bytes(a,4);
                            if (puVar23 == (uchar *)0x0) goto LAB_0035ef50;
                            *(undefined4 *)((long)&local_70->numUnpackStreams + uVar41 * 0x58 + 4) =
                                 *(undefined4 *)puVar23;
                          }
                        }
                        goto LAB_0035e99e;
                      case 0x16:
                      case 0x17:
                      case 0x18:
                        break;
                      case 0x19:
                        if (size == 0) goto LAB_0035e99e;
                      }
                    }
                    puVar17 = header_bytes(a,size);
                  } while (puVar17 != (uchar *)0x0);
                }
              }
            }
          }
        }
LAB_0035ef50:
        if (*piVar15 == 0xc) {
          pcVar27 = "Couldn\'t allocate memory";
        }
        else {
          pcVar27 = "Damaged 7-Zip archive";
        }
        goto LAB_0035f1a9;
      }
      bVar42 = false;
      archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
    }
  }
LAB_0035e242:
  free(header.emptyStreamBools);
  free(header.emptyFileBools);
  free(header.antiBools);
  free(header.attrBools);
  if (!bVar42) {
    return iVar9;
  }
  puVar12 = (uint64_t *)si[1].ci.numFolders;
  p_Var37 = si[1].ci.folders;
  si[1].pi.positions = puVar12;
LAB_0035e28d:
  si[1].ci.dataStreamIndex = (uint64_t)p_Var37;
  if (p_Var37 == (_7z_folder *)0x0 || puVar12 == (uint64_t *)0x0) {
    iVar9 = 1;
  }
  else {
    si[1].pi.positions = (uint64_t *)((long)puVar12 + -1);
    si[1].ss.unpackSizes = (uint64_t *)0x0;
    *(undefined1 *)&si[2].pi.pos = 0;
    puVar13 = (uint32_t *)cm_zlib_crc32(0,(uchar *)0x0,0);
    si[1].ss.digests = puVar13;
    if (si[0xc6].ci.dataStreamIndex == 0) {
      paVar14 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
      si[0xc6].ci.dataStreamIndex = (uint64_t)paVar14;
      if (paVar14 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    uVar41 = (ulong)(uint)p_Var37->numBindPairs;
    if ((uVar41 < (si->ci).numFolders) && (p_Var29 = (si->ci).folders, p_Var29 != (_7z_folder *)0x0)
       ) {
      p_Var29 = p_Var29 + uVar41;
      lVar39 = 0;
      for (uVar41 = 0; uVar41 < p_Var29->numCoders; uVar41 = uVar41 + 1) {
        lVar24 = *(long *)((long)&p_Var29->coders->codec + lVar39);
        if (((lVar24 == 0x6f10101) || (lVar24 == 0x6f10701)) || (lVar24 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[199].pi.digest.digests = 1;
        }
        lVar39 = lVar39 + 0x28;
      }
    }
    if (*(int *)&si[199].pi.digest.digests == -1) {
      *(undefined4 *)&si[199].pi.digest.digests = 0;
    }
    wVar7 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var37->coders,p_Var37->numCoders,
                       (archive_string_conv *)si[0xc6].ci.dataStreamIndex);
    if (wVar7 == L'\0') {
      iVar9 = 0;
    }
    else {
      piVar15 = __errno_location();
      if (*piVar15 == 0xc) {
        pcVar27 = "Can\'t allocate memory for Pathname";
LAB_0035e56d:
        archive_set_error(&a->archive,0xc,pcVar27);
        return -0x1e;
      }
      pcVar27 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc6].ci.dataStreamIndex);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar27);
      iVar9 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)p_Var37->numUnpackStreams);
    uVar31 = *(uint *)&p_Var37->bindPairs;
    if ((uVar31 & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var37->numPackedStreams,p_Var37->numOutStreams);
      uVar31 = *(uint *)&p_Var37->bindPairs;
    }
    if ((uVar31 & 4) != 0) {
      lVar39._0_1_ = p_Var37->digest_defined;
      lVar39._1_3_ = *(undefined3 *)&p_Var37->field_0x49;
      lVar39._4_4_ = p_Var37->digest;
      archive_entry_set_ctime(entry,p_Var37->numInStreams,lVar39);
      uVar31 = *(uint *)&p_Var37->bindPairs;
    }
    if ((uVar31 & 2) != 0) {
      archive_entry_set_atime(entry,(time_t)p_Var37->packedStreams,(long)p_Var37->unPackSize);
    }
    uVar41 = (ulong)*(uint *)((long)&p_Var37->numBindPairs + 4);
    if (uVar41 == 0xffffffff) {
      puVar17 = (uchar *)0x0;
    }
    else {
      puVar17 = (uchar *)(si->ss).unpackSizes[uVar41];
    }
    si[1].ss.digestsDefined = puVar17;
    archive_entry_set_size(entry,(la_int64_t)puVar17);
    puVar17 = si[1].ss.digestsDefined;
    if (puVar17 == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((p_Var37->numUnpackStreams & 0xf000) == 0xa000) {
      lVar39 = 0;
      pcVar27 = (char *)0x0;
      while (puVar17 != (uchar *)0x0) {
        iVar8 = archive_read_format_7zip_read_data(a,(void **)&header,&size,&offset);
        uVar33 = size;
        if (iVar8 < -0x14) {
          free(pcVar27);
          return iVar8;
        }
        pcVar16 = (char *)realloc(pcVar27,size + lVar39 + 1);
        if (pcVar16 == (char *)0x0) {
          free(pcVar27);
          pcVar27 = "Can\'t allocate memory for Symname";
          goto LAB_0035e56d;
        }
        memcpy(pcVar16 + lVar39,(void *)header.dataIndex,uVar33);
        lVar39 = lVar39 + uVar33;
        pcVar27 = pcVar16;
        puVar17 = si[1].ss.digestsDefined;
      }
      if (lVar39 == 0) {
        uVar31 = (uint)p_Var37->numUnpackStreams & 0xffff0fff | 0x8000;
        *(uint *)&p_Var37->numUnpackStreams = uVar31;
        archive_entry_set_mode(entry,uVar31);
      }
      else {
        pcVar27[lVar39] = '\0';
        archive_entry_copy_symlink(entry,pcVar27);
      }
      free(pcVar27);
      archive_entry_set_size(entry,0);
    }
    *(undefined2 *)((long)&si[0xc6].ss.unpack_streams + 4) = 0x70;
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].ss;
  }
  return iVar9;
LAB_0035efa3:
  uVar41 = (ulong)uVar34;
  if (val->numFolders <= uVar41) goto LAB_0035f182;
  if ((header.emptyStreamBools == (uchar *)0x0) || (header.emptyStreamBools[uVar41] == '\0')) {
    uVar32 = *(uint *)(&local_70->bindPairs + uVar41 * 0xb) | 0x10;
    *(uint *)(&local_70->bindPairs + uVar41 * 0xb) = uVar32;
  }
  else {
    uVar32 = *(uint *)(&local_70->bindPairs + uVar41 * 0xb);
  }
  puVar12 = &local_70->numCoders + uVar41 * 0xb;
  uVar30 = *(uint *)((long)&local_70->numUnpackStreams + uVar41 * 0x58 + 4);
  uVar40 = uVar30 >> 0x10;
  *(uint *)(&local_70->numUnpackStreams + uVar41 * 0xb) = uVar40;
  if ((uVar32 & 0x10) == 0) {
    if (header.emptyFileBools == (uchar *)0x0) {
      if (0xffff < uVar30) {
        bVar42 = false;
        goto LAB_0035f09c;
      }
LAB_0035f091:
      *(undefined4 *)(puVar12 + 10) = 0x41ff;
LAB_0035f0d3:
      uVar41 = *puVar12;
      if ((1 < uVar41) &&
         ((p_Var25 = (_7z_coder *)puVar12[1], *(char *)((long)p_Var25 + (uVar41 - 2)) != '/' ||
          (*(char *)((long)p_Var25 + (uVar41 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var25->codec + uVar41) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar12[1])->codec + *puVar12 + 1) = 0;
        *puVar12 = *puVar12 + 2;
        uVar30 = *(uint *)((long)puVar12 + 0x54);
      }
    }
    else {
      iVar8 = (int)local_78;
      bVar42 = header.emptyFileBools[iVar8] != '\0';
      local_78 = (ulong)(iVar8 + 1);
      if (uVar30 < 0x10000) {
        if (header.emptyFileBools[iVar8] == '\0') goto LAB_0035f091;
        *(undefined4 *)(puVar12 + 10) = 0x81b6;
      }
      else {
LAB_0035f09c:
        if (((uVar30 & 0xf0000000) != 0x40000000) && (!bVar42)) {
          uVar40 = uVar40 & 0xfff | 0x4000;
          *(uint *)(puVar12 + 10) = uVar40;
        }
        if ((uVar40 & 0xf000) == 0x4000) goto LAB_0035f0d3;
      }
    }
    *(undefined4 *)((long)puVar12 + 0x14) = 0xffffffff;
  }
  else {
    if ((si_00->ss).unpack_streams <= (ulong)(long)iVar9) goto LAB_0035ef50;
    if (uVar30 < 0x10000) {
      *(undefined4 *)(puVar12 + 10) = 0x81b6;
    }
    if ((si_00->ss).digestsDefined[iVar9] != '\0') {
      *(uint *)(puVar12 + 3) = uVar32 | 8;
    }
    *(int *)((long)puVar12 + 0x14) = iVar9;
    iVar9 = iVar9 + 1;
  }
  if ((uVar30 & 1) != 0) {
    *(byte *)(puVar12 + 10) = (byte)puVar12[10] & 0x6d;
  }
  if (((ulong)puVar12[3] & 0x10) == 0 && uVar36 == 0) {
    *(undefined4 *)(puVar12 + 2) = 0xffffffff;
    uVar36 = 0;
  }
  else {
    if (uVar36 == 0) {
      while( true ) {
        if ((si_00->ci).numFolders <= (ulong)uVar31) goto LAB_0035ef50;
        if (p_Var37[uVar31].numUnpackStreams != 0) break;
        uVar31 = uVar31 + 1;
      }
    }
    *(uint *)(puVar12 + 2) = uVar31;
    if (((ulong)puVar12[3] & 0x10) != 0) {
      uVar36 = uVar36 + 1;
      uVar21 = (ulong)uVar36;
      uVar41 = p_Var37[uVar31].numUnpackStreams;
      if (uVar41 <= uVar21) {
        uVar36 = 0;
      }
      uVar31 = uVar31 + (uVar41 <= uVar21);
    }
  }
  uVar34 = uVar34 + 1;
  goto LAB_0035efa3;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}